

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O3

void __thiscall ncnn::Deconvolution_x86_avx::Deconvolution_x86_avx(Deconvolution_x86_avx *this)

{
  undefined1 auVar1 [32];
  
  Deconvolution::Deconvolution((Deconvolution *)&this->field_0x60);
  this->_vptr_Deconvolution_x86_avx = (_func_int **)&PTR_create_pipeline_005decf0;
  *(undefined ***)&this->field_0x60 = &PTR__Deconvolution_x86_avx_005ded70;
  (this->weight_data_tm).cstep = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  this->field_0x6b = 1;
  auVar1 = ZEXT432(0) << 0x40;
  this->activation = (Layer *)auVar1._0_8_;
  this->gemm = (Layer *)auVar1._8_8_;
  (this->weight_data_tm).data = (void *)auVar1._16_8_;
  (this->weight_data_tm).refcount = (int *)auVar1._24_8_;
  return;
}

Assistant:

Deconvolution_x86_avx::Deconvolution_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}